

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<QKmsPlane*,long_long>
               (QKmsPlane *first,longlong n,QKmsPlane *d_first)

{
  Data *pDVar1;
  uint *puVar2;
  qsizetype qVar3;
  QKmsPlane *pQVar4;
  Type TVar5;
  Rotations RVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  QKmsPlane **ppQVar21;
  QKmsPlane *pQVar22;
  QKmsPlane *pQVar23;
  QKmsPlane *pQVar24;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  pQVar22 = d_first + n;
  pQVar24 = first;
  pQVar4 = pQVar22;
  if (first < pQVar22) {
    pQVar24 = pQVar22;
    pQVar4 = first;
  }
  pQVar23 = d_first;
  if (pQVar4 != d_first) {
    do {
      pQVar23->possibleCrtcs = first->possibleCrtcs;
      TVar5 = first->type;
      pQVar23->id = first->id;
      pQVar23->type = TVar5;
      pDVar1 = (first->supportedFormats).d.d;
      (first->supportedFormats).d.d = (Data *)0x0;
      (pQVar23->supportedFormats).d.d = pDVar1;
      puVar2 = (first->supportedFormats).d.ptr;
      (first->supportedFormats).d.ptr = (uint *)0x0;
      (pQVar23->supportedFormats).d.ptr = puVar2;
      qVar3 = (first->supportedFormats).d.size;
      (first->supportedFormats).d.size = 0;
      (pQVar23->supportedFormats).d.size = qVar3;
      RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (first->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar7 = first->rotationPropertyId;
      uVar8 = first->crtcPropertyId;
      uVar9 = first->framebufferPropertyId;
      uVar10 = first->srcXPropertyId;
      uVar11 = first->srcYPropertyId;
      uVar12 = first->crtcXPropertyId;
      uVar13 = first->crtcYPropertyId;
      uVar14 = first->srcwidthPropertyId;
      uVar15 = first->srcheightPropertyId;
      uVar16 = first->crtcwidthPropertyId;
      uVar17 = first->crtcheightPropertyId;
      uVar18 = first->zposPropertyId;
      uVar19 = first->blendOpPropertyId;
      uVar20 = first->activeCrtcId;
      pQVar23->initialRotation =
           (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
           (first->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      pQVar23->availableRotations =
           (Rotations)
           RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar23->rotationPropertyId = uVar7;
      pQVar23->crtcPropertyId = uVar8;
      pQVar23->framebufferPropertyId = uVar9;
      pQVar23->srcXPropertyId = uVar10;
      pQVar23->srcYPropertyId = uVar11;
      pQVar23->crtcXPropertyId = uVar12;
      pQVar23->crtcYPropertyId = uVar13;
      pQVar23->srcwidthPropertyId = uVar14;
      pQVar23->srcheightPropertyId = uVar15;
      pQVar23->crtcwidthPropertyId = uVar16;
      pQVar23->crtcheightPropertyId = uVar17;
      pQVar23->zposPropertyId = uVar18;
      pQVar23->blendOpPropertyId = uVar19;
      pQVar23->activeCrtcId = uVar20;
      pQVar23 = pQVar23 + 1;
      first = first + 1;
    } while (pQVar23 != pQVar4);
  }
  local_48.end = d_first;
  local_48.intermediate = pQVar23;
  for (; ppQVar21 = &local_48.end, pQVar23 != pQVar22; pQVar23 = pQVar23 + 1) {
    pQVar23->possibleCrtcs = first->possibleCrtcs;
    TVar5 = first->type;
    pQVar23->id = first->id;
    pQVar23->type = TVar5;
    QArrayDataPointer<unsigned_int>::operator=
              (&(pQVar23->supportedFormats).d,&(first->supportedFormats).d);
    RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.super_QFlagsStorage<QKmsPlane::Rotation>
    .i = (first->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    uVar7 = first->rotationPropertyId;
    uVar8 = first->crtcPropertyId;
    uVar9 = first->framebufferPropertyId;
    uVar10 = first->srcXPropertyId;
    uVar11 = first->srcYPropertyId;
    uVar12 = first->crtcXPropertyId;
    uVar13 = first->crtcYPropertyId;
    uVar14 = first->srcwidthPropertyId;
    uVar15 = first->srcheightPropertyId;
    uVar16 = first->crtcwidthPropertyId;
    uVar17 = first->crtcheightPropertyId;
    uVar18 = first->zposPropertyId;
    uVar19 = first->blendOpPropertyId;
    uVar20 = first->activeCrtcId;
    pQVar23->initialRotation =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         (first->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    pQVar23->availableRotations =
         (Rotations)
         RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar23->rotationPropertyId = uVar7;
    pQVar23->crtcPropertyId = uVar8;
    pQVar23->framebufferPropertyId = uVar9;
    pQVar23->srcXPropertyId = uVar10;
    pQVar23->srcYPropertyId = uVar11;
    pQVar23->crtcXPropertyId = uVar12;
    pQVar23->crtcYPropertyId = uVar13;
    pQVar23->srcwidthPropertyId = uVar14;
    pQVar23->srcheightPropertyId = uVar15;
    pQVar23->crtcwidthPropertyId = uVar16;
    pQVar23->crtcheightPropertyId = uVar17;
    pQVar23->zposPropertyId = uVar18;
    pQVar23->blendOpPropertyId = uVar19;
    pQVar23->activeCrtcId = uVar20;
    first = first + 1;
  }
  for (; local_48.iter = ppQVar21, first != pQVar24; first = first + -1) {
    pDVar1 = first[-1].supportedFormats.d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].supportedFormats.d.d)->super_QArrayData,4,0x10);
      }
    }
    ppQVar21 = local_48.iter;
  }
  q_relocate_overlap_n_left_move<QKmsPlane_*,_long_long>::Destructor::~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}